

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.hpp
# Opt level: O0

void __thiscall
ableton::link::
Measurement<ableton::platforms::asio::AsioService,ableton::platforms::linux::Clock<1>,ableton::discovery::Socket<512ul>,ableton::util::NullLog>
::Impl::
sendPing<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>>
          (Impl *this,endpoint *to,
          Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
          *payload)

{
  iterator out;
  uchar *__last;
  void *__buf;
  element_type *this_00;
  pointer pvVar1;
  int in_R8D;
  runtime_error *err;
  size_t numBytes;
  uchar *msgEnd;
  iterator msgBegin;
  MessageBuffer buffer;
  Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
  *payload_local;
  endpoint *to_local;
  Impl *this_local;
  
  buffer._M_elems._504_8_ = payload;
  out = std::begin<std::array<unsigned_char,512ul>>((array<unsigned_char,_512UL> *)&msgBegin);
  __last = v1::
           pingMessage<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                     ((Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
                       *)buffer._M_elems._504_8_,out);
  __buf = (void *)std::distance<unsigned_char*>(out,__last);
  this_00 = std::
            __shared_ptr_access<ableton::discovery::Socket<512UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ableton::discovery::Socket<512UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(this + 0x10));
  pvVar1 = std::array<unsigned_char,_512UL>::data((array<unsigned_char,_512UL> *)&msgBegin);
  discovery::Socket<512UL>::send(this_00,(int)pvVar1,__buf,(size_t)to,in_R8D);
  return;
}

Assistant:

void sendPing(asio::ip::udp::endpoint to, const Payload& payload)
    {
      v1::MessageBuffer buffer;
      const auto msgBegin = std::begin(buffer);
      const auto msgEnd = v1::pingMessage(payload, msgBegin);
      const auto numBytes = static_cast<size_t>(std::distance(msgBegin, msgEnd));

      try
      {
        mpSocket->send(buffer.data(), numBytes, to);
      }
      catch (const std::runtime_error& err)
      {
        info(*mLog) << "Failed to send Ping to " << to.address().to_string() << ": "
                    << err.what();
      }
    }